

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

SearchResult<unsigned_long,_false> __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,std::less<google::protobuf::Edition>,std::allocator<google::protobuf::Edition>,256,false>>
::
binary_search<google::protobuf::Edition,absl::lts_20250127::container_internal::key_compare_adapter<std::less<google::protobuf::Edition>,google::protobuf::Edition>::checked_compare>
          (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,std::less<google::protobuf::Edition>,std::allocator<google::protobuf::Edition>,256,false>>
           *this,Edition *k,checked_compare *comp)

{
  field_type fVar1;
  SearchResult<unsigned_long,_false> SVar2;
  
  fVar1 = btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
          ::start((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                   *)this);
  if (((ulong)this & 7) == 0) {
    SVar2 = binary_search_impl<google::protobuf::Edition,absl::lts_20250127::container_internal::key_compare_adapter<std::less<google::protobuf::Edition>,google::protobuf::Edition>::checked_compare>
                      (this,k,fVar1,this[10],comp);
    return (SearchResult<unsigned_long,_false>)SVar2.value;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>> *, unsigned int, unsigned char, google::protobuf::Edition, absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 61, 62>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>> *, unsigned int, unsigned char, google::protobuf::Edition, absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::Edition, std::less<google::protobuf::Edition>, std::allocator<google::protobuf::Edition>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 61, 62>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
               );
}

Assistant:

SearchResult<size_type, btree_is_key_compare_to<Compare, key_type>::value>
  binary_search(const K &k, const Compare &comp) const {
    return binary_search_impl(k, start(), finish(), comp,
                              btree_is_key_compare_to<Compare, key_type>());
  }